

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void readData(string *filename,long *dataNumber,mydataFmt **pTeam,int length)

{
  mydataFmt *pmVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  istream *piVar5;
  ostream *poVar6;
  double dVar7;
  exception *e;
  int pos;
  int count;
  int i;
  long local_258;
  long temp;
  string line;
  ifstream in;
  int length_local;
  mydataFmt **pTeam_local;
  long *dataNumber_local;
  string *filename_local;
  
  pcVar4 = (char *)std::__cxx11::string::data();
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar4,_S_in);
  std::__cxx11::string::string((string *)&temp);
  local_258 = *dataNumber;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&line.field_2 + *(long *)(line.field_2._8_8_ + -0x18) + 8));
  if (bVar2) {
    pos = 0;
    e._4_4_ = 0;
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),(string *)&temp);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      if (pos < local_258) {
        std::__cxx11::string::erase((ulong)&temp,0);
        iVar3 = std::__cxx11::string::find((char)&temp,0x5d);
        std::__cxx11::string::erase((ulong)&temp,(long)iVar3);
        iVar3 = std::__cxx11::string::find((char)&temp,0xd);
        if (iVar3 != -1) {
          std::__cxx11::string::erase((ulong)&temp,(long)iVar3);
        }
        if (dataNumber[e._4_4_] != 0) {
          pcVar4 = (char *)std::__cxx11::string::data();
          dVar7 = atof(pcVar4);
          pmVar1 = pTeam[e._4_4_];
          pTeam[e._4_4_] = pmVar1 + 1;
          *pmVar1 = (float)dVar7;
        }
      }
      else {
        e._4_4_ = e._4_4_ + 1;
        if ((length != 0) && (e._4_4_ == length)) break;
        local_258 = local_258 + dataNumber[e._4_4_];
        std::__cxx11::string::erase((ulong)&temp,0);
        iVar3 = std::__cxx11::string::find((char)&temp,0x5d);
        std::__cxx11::string::erase((ulong)&temp,(long)iVar3);
        iVar3 = std::__cxx11::string::find((char)&temp,0xd);
        if (iVar3 != -1) {
          std::__cxx11::string::erase((ulong)&temp,(long)iVar3);
        }
        if (dataNumber[e._4_4_] != 0) {
          pcVar4 = (char *)std::__cxx11::string::data();
          dVar7 = atof(pcVar4);
          pmVar1 = pTeam[e._4_4_];
          pTeam[e._4_4_] = pmVar1 + 1;
          *pmVar1 = (float)dVar7;
        }
      }
      pos = pos + 1;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"no such file");
    poVar6 = std::operator<<(poVar6,(string *)filename);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&temp);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return;
}

Assistant:

void readData(string filename, long dataNumber[], mydataFmt *pTeam[], int length) {
    ifstream in(filename.data());
    string line;
    long temp = dataNumber[0];
    if (in) {
        int i = 0;
        int count = 0;
        int pos = 0;
        while (getline(in, line)) {
            try {
                if (i < temp) {
                    line.erase(0, 1);
                    pos = line.find(']');
                    line.erase(pos, 1);
                    pos = line.find('\r');
                    if (pos != -1) {
                        line.erase(pos, 1);
                    }
                    if (dataNumber[count] != 0) {
                        *(pTeam[count])++ = atof(line.data());
                    }
                } else {
                    count++;
                    if ((length != 0) && (count == length))
                        break;
                    temp += dataNumber[count];
                    line.erase(0, 1);
                    pos = line.find(']');
                    line.erase(pos, 1);
                    pos = line.find('\r');
                    if (pos != -1) {
                        line.erase(pos, 1);
                    }
                    if (dataNumber[count] != 0) {
                        *(pTeam[count])++ = atof(line.data());
                    }
                }
                i++;
            }
            catch (exception &e) {
                cout << " error " << i << endl;
                return;
            }
        }
    } else {
        cout << "no such file" << filename << endl;
    }
}